

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::ProgramUniformCase::activeUniformi
          (ProgramUniformCase *this,Functions *gl,int arraySize,int *location,int *value)

{
  GLint *pGVar1;
  int *value_local;
  int *location_local;
  int arraySize_local;
  Functions *gl_local;
  ProgramUniformCase *this_local;
  
  (*gl->uniform1i)(*location,*value);
  (*gl->uniform2i)(location[1],value[1],value[2]);
  (*gl->uniform3i)(location[2],value[3],value[4],value[5]);
  (*gl->uniform4i)(location[3],value[6],value[7],value[8],value[9]);
  pGVar1 = value + 10;
  (*gl->uniform1iv)(location[4],arraySize,pGVar1);
  pGVar1 = pGVar1 + arraySize;
  (*gl->uniform2iv)(location[6],arraySize,pGVar1);
  (*gl->uniform3iv)(location[8],arraySize,pGVar1 + (arraySize << 1));
  (*gl->uniform4iv)(location[10],arraySize,pGVar1 + (arraySize << 1) + arraySize * 3);
  return;
}

Assistant:

void activeUniformi(const glw::Functions& gl, int arraySize, int* location, int* value)
	{
		gl.uniform1i(location[0], value[0]);
		value += 1;
		gl.uniform2i(location[1], value[0], value[1]);
		value += 2;
		gl.uniform3i(location[2], value[0], value[1], value[2]);
		value += 3;
		gl.uniform4i(location[3], value[0], value[1], value[2], value[3]);
		value += 4;

		gl.uniform1iv(location[4], arraySize, value);
		value += 1 * arraySize;
		gl.uniform2iv(location[6], arraySize, value);
		value += 2 * arraySize;
		gl.uniform3iv(location[8], arraySize, value);
		value += 3 * arraySize;
		gl.uniform4iv(location[10], arraySize, value);
	}